

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O2

node_t * __thiscall
expression_tree::node<int,_expression_tree::no_caching,_expression_tree::sequential>::operator=
          (node<int,_expression_tree::no_caching,_expression_tree::sequential> *this,
          function<int_()> *f)

{
  node_impl<int> *pnVar1;
  leaf<int_(*)()> *this_00;
  function<int_()> fStack_38;
  
  this_00 = (leaf<int_(*)()> *)operator_new(0x28);
  std::function<int_()>::function(&fStack_38,f);
  detail::leaf<int_(*)()>::leaf(this_00,&fStack_38);
  pnVar1 = (this->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
  (this->impl)._M_t.
  super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl =
       (node_impl<int> *)this_00;
  if (pnVar1 != (node_impl<int> *)0x0) {
    (*pnVar1->_vptr_node_impl[1])();
  }
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  if (this->parent != (node<int,_expression_tree::no_caching,_expression_tree::sequential> *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const std::function<T ()>& f)
	{
		impl.reset(new detail::leaf<T (*)()>(f));
		
		if(parent)
		{
			parent->modified();
		}
		
		return *this;
	}